

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O3

void pobr::utils::Logger::debugFatal(string *message)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  Exception *this;
  string local_58;
  string local_38;
  
  paVar1 = &local_58.field_2;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Fatal","");
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"magenta","");
  TerminalPrinter::printLabel(&local_58,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Fatal","");
  uVar2 = TerminalPrinter::getLabelLength(&local_58);
  local_38._M_dataplus._M_p._0_4_ = uVar2;
  print((uint *)&local_38,message);
  std::__cxx11::string::~string((string *)&local_58);
  this = (Exception *)__cxa_allocate_exception(0x28);
  Exception::Exception(this,message);
  __cxa_throw(this,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void Logger::debugFatal(const std::string& message)
{
    Logger::printLabel("Fatal", "magenta");
    Logger::print(Logger::getLabelLength("Fatal"), message);

    throw Logger::Exception(message);
}